

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O3

void __thiscall S2LaxPolygonShape::Encode(S2LaxPolygonShape *this,Encoder *encoder,CodingHint hint)

{
  uint uVar1;
  uchar *puVar2;
  long lVar3;
  anon_union_8_2_29389cd6_for_S2LaxPolygonShape_4 *paVar4;
  Encoder *encoder_00;
  undefined7 in_register_00000011;
  Encoder *in_R8;
  Span<const_Vector3<double>_> points;
  Span<const_unsigned_int> v;
  
  Encoder::Ensure(encoder,6);
  Encoder::put8(encoder,'\x01');
  puVar2 = (uchar *)Varint::Encode32((char *)encoder->buf_,
                                     *(uint32 *)&(this->super_S2Shape).field_0xc);
  encoder->buf_ = puVar2;
  lVar3 = (long)*(int *)&(this->super_S2Shape).field_0xc;
  paVar4 = (anon_union_8_2_29389cd6_for_S2LaxPolygonShape_4 *)
           ((this->field_2).cumulative_vertices_ + lVar3);
  if (lVar3 < 2) {
    paVar4 = &this->field_2;
  }
  points.ptr_ = (pointer)(long)paVar4->num_vertices_;
  points.len_ = CONCAT71(in_register_00000011,hint) & 0xffffffff;
  encoder_00 = encoder;
  s2coding::EncodeS2PointVector
            ((s2coding *)
             (this->vertices_)._M_t.
             super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
             super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
             super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl,points,(CodingHint)encoder
             ,in_R8);
  uVar1 = *(uint *)&(this->super_S2Shape).field_0xc;
  if (1 < (int)uVar1) {
    v.ptr_ = (pointer)((ulong)uVar1 + 1);
    v.len_ = (size_type)encoder;
    s2coding::EncodeUintVector<unsigned_int>
              ((s2coding *)(this->field_2).cumulative_vertices_,v,encoder_00);
    return;
  }
  return;
}

Assistant:

void S2LaxPolygonShape::Encode(Encoder* encoder,
                               s2coding::CodingHint hint) const {
  encoder->Ensure(1 + Varint::kMax32);
  encoder->put8(kCurrentEncodingVersionNumber);
  encoder->put_varint32(num_loops_);
  s2coding::EncodeS2PointVector(MakeSpan(vertices_.get(), num_vertices()),
                                hint, encoder);
  if (num_loops() > 1) {
    s2coding::EncodeUintVector<uint32>(MakeSpan(cumulative_vertices_,
                                                num_loops() + 1), encoder);
  }
}